

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O3

CURLcode PostCurlIngestConnection::send_curl_post
                   (string *post_url,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  FILE *__stream;
  CURLcode CVar1;
  CURLcode CVar2;
  undefined8 uVar3;
  
  uVar3 = curl_easy_init();
  curl_easy_setopt(uVar3,0x2712,(post_url->_M_dataplus)._M_p);
  curl_easy_setopt(uVar3,0x40,0);
  curl_easy_setopt(uVar3,0x51,0);
  curl_easy_setopt(uVar3,0x2f,1);
  curl_easy_setopt(uVar3,0x54,2);
  curl_easy_setopt(uVar3,0x271f,
                   (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start);
  curl_easy_setopt(uVar3,0x3c,
                   (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start);
  CVar1 = curl_easy_perform(uVar3);
  curl_easy_cleanup(uVar3);
  __stream = _stderr;
  CVar2 = CURLE_OK;
  if (CVar1 != CURLE_OK) {
    uVar3 = curl_easy_strerror(CVar1);
    fprintf(__stream," CURL HTTP post of segment failed:  %s\n",uVar3);
    CVar2 = CVar1;
  }
  return CVar2;
}

Assistant:

static CURLcode send_curl_post(std::string &post_url, std::vector<uint8_t> &data) {
       
            try {
                CURL* curl = curl_easy_init();
                curl_easy_setopt(curl, CURLOPT_URL, post_url.c_str());
                curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
                curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
                curl_easy_setopt(curl, CURLOPT_POST, 1);
                curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_1);
                struct curl_slist* hs = NULL;
                //hs = curl_slist_append(hs, "Content-Type: application/mp4");
                //curl_easy_setopt(curl, CURLOPT_HTTPHEADER, hs);
                curl_easy_setopt(curl, CURLOPT_POSTFIELDS, (char*)&data[0]);
                curl_easy_setopt(curl, CURLOPT_POSTFIELDSIZE, (long)data.size());
                CURLcode res = curl_easy_perform(curl);
                curl_easy_cleanup(curl);
                //curl_slist_free_all(hs);
                if (res != CURLE_OK)
                    fprintf(stderr, " CURL HTTP post of segment failed:  %s\n",
                        curl_easy_strerror(res));
               
                return res;
            }
            catch (...)
            {
                std::cout << "unkown error occured" << std::endl;
                return CURLcode::CURLE_INTERFACE_FAILED;
            }
            return CURLcode::CURLE_OK;
       
    }